

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

int __thiscall smf::Options::getRegIndex(Options *this,string *optionName)

{
  bool bVar1;
  iterator iVar2;
  ostream *poVar3;
  _Rb_tree_color _Var4;
  
  _Var4 = ~_S_red;
  if ((this->m_suppressQ == true) && (bVar1 = std::operator==(optionName,"options"), bVar1)) {
    return -1;
  }
  bVar1 = std::operator==(optionName,"options");
  if (bVar1) {
    print(this,(ostream *)&std::cout);
    exit(0);
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_optionList)._M_t,optionName);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_optionList)._M_t._M_impl.super__Rb_tree_header)
  {
    if (this->m_options_error_check != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: unknown option \"");
      poVar3 = std::operator<<(poVar3,(string *)optionName);
      poVar3 = std::operator<<(poVar3,"\".");
      std::endl<char,std::char_traits<char>>(poVar3);
      print(this,(ostream *)&std::cout);
      exit(1);
    }
  }
  else {
    _Var4 = iVar2._M_node[2]._M_color;
  }
  return _Var4;
}

Assistant:

int Options::getRegIndex(const std::string& optionName) {
	if (m_suppressQ && (optionName == "options")) {
			return -1;
	}

	if (optionName == "options") {
		print(std::cout);
		exit(0);
	}


	auto it = m_optionList.find(optionName);
	if (it == m_optionList.end()) {
		if (m_options_error_check) {
			std::cerr << "Error: unknown option \"" << optionName << "\"." << std::endl;
			print(std::cout);
			exit(1);
		} else {
			return -1;
		}
	} else {
		return it->second;
	}
}